

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O2

int __thiscall Assimp::ObjFileParser::getMaterialIndex(ObjFileParser *this,string *strMaterialName)

{
  Model *pMVar1;
  long lVar2;
  __type _Var3;
  long lVar4;
  size_t index;
  ulong uVar5;
  
  if (strMaterialName->_M_string_length != 0) {
    lVar4 = 0;
    for (uVar5 = 0;
        pMVar1 = (this->m_pModel)._M_t.
                 super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                 .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl,
        lVar2 = *(long *)&(pMVar1->m_MaterialLib).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl,
        uVar5 < (ulong)((long)*(pointer *)
                               ((long)&(pMVar1->m_MaterialLib).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               + 8) - lVar2 >> 5); uVar5 = uVar5 + 1) {
      _Var3 = std::operator==(strMaterialName,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (lVar2 + lVar4));
      if (_Var3) {
        return (int)uVar5;
      }
      lVar4 = lVar4 + 0x20;
    }
  }
  return -1;
}

Assistant:

int ObjFileParser::getMaterialIndex( const std::string &strMaterialName )
{
    int mat_index = -1;
    if( strMaterialName.empty() ) {
        return mat_index;
    }
    for (size_t index = 0; index < m_pModel->m_MaterialLib.size(); ++index)
    {
        if ( strMaterialName == m_pModel->m_MaterialLib[ index ])
        {
            mat_index = (int)index;
            break;
        }
    }
    return mat_index;
}